

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O3

float __thiscall
deqp::gles3::Functional::Vertex2DTextureCase::calculateLod
          (Vertex2DTextureCase *this,Vec2 *texScale,Vec2 *dstSize,int textureNdx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  uVar1 = (this->m_textures[textureNdx]->m_refTexture).m_width;
  uVar2 = (this->m_textures[textureNdx]->m_refTexture).m_height;
  auVar5._0_4_ = (float)*(undefined8 *)texScale->m_data * (float)(int)uVar1;
  auVar5._4_4_ = (float)((ulong)*(undefined8 *)texScale->m_data >> 0x20) * (float)(int)uVar2;
  auVar5._8_8_ = 0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)dstSize->m_data;
  auVar6 = divps(auVar5,auVar6);
  uVar3 = -(uint)(auVar6._4_4_ <= auVar6._0_4_);
  fVar4 = logf((float)(~uVar3 & (uint)auVar6._4_4_ | (uint)auVar6._0_4_ & uVar3));
  return fVar4 * 1.442695;
}

Assistant:

float Vertex2DTextureCase::calculateLod (const Vec2& texScale, const Vec2& dstSize, int textureNdx) const
{
	const tcu::Texture2D&		refTexture	= m_textures[textureNdx]->getRefTexture();
	const Vec2					srcSize		= Vec2((float)refTexture.getWidth(), (float)refTexture.getHeight());
	const Vec2					sizeRatio	= texScale*srcSize / dstSize;

	// \note In this particular case dv/dx and du/dy are zero, simplifying the expression.
	return deFloatLog2(de::max(sizeRatio.x(), sizeRatio.y()));
}